

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_rinfo(CHAR_DATA *ch,char *argument)

{
  flag_type *pfVar1;
  ulong uVar2;
  double dVar3;
  ROOM_INDEX_DATA *pRVar4;
  size_t sVar5;
  char *__src;
  ulong uVar6;
  flag_type *pfVar7;
  char *txt;
  char buf [4608];
  char arg [4608];
  char acStack_2428 [16];
  undefined2 auStack_2418 [2296];
  char local_1228 [4608];
  
  txt = acStack_2428;
  one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    pRVar4 = ch->in_room;
  }
  else {
    pRVar4 = find_location(ch,local_1228);
  }
  if (pRVar4 == (ROOM_INDEX_DATA *)0x0) {
    txt = "No such location.\n\r";
  }
  else {
    sprintf(acStack_2428,"Room %d flags (%s):\n\r",(ulong)(uint)(int)pRVar4->vnum,pRVar4->name);
    if ((pRVar4->area->area_flags[0] & 1) != 0) {
      sVar5 = strlen(acStack_2428);
      builtin_strncpy(acStack_2428 + sVar5,"AREA_EXPLORE\n\r",0xf);
    }
    if ((pRVar4->area->area_flags[0] & 2) != 0) {
      sVar5 = strlen(acStack_2428);
      builtin_strncpy(acStack_2428 + sVar5,"AREA_NO_NEWBIES\n",0x10);
      *(undefined2 *)((long)auStack_2418 + sVar5) = 0xd;
    }
    if ((pRVar4->area->area_flags[0] & 4) != 0) {
      sVar5 = strlen(acStack_2428);
      builtin_strncpy(acStack_2428 + sVar5,"AREA_UNGHOST\n\r",0xf);
    }
    pfVar7 = room_flags;
    do {
      uVar2 = pfVar7->bit;
      uVar6 = uVar2 + 0x1f;
      if (-1 < (long)uVar2) {
        uVar6 = uVar2;
      }
      uVar6 = pRVar4->room_flags[(int)(uVar6 >> 5)];
      dVar3 = exp2((double)((long)uVar2 % 0x20));
      if ((uVar6 & (long)dVar3) != 0) {
        sVar5 = strlen(acStack_2428);
        builtin_strncpy(acStack_2428 + sVar5,"ROOM ",6);
        __src = upstring(pfVar7->name);
        strcat(acStack_2428,__src);
        sVar5 = strlen(acStack_2428);
        (acStack_2428 + sVar5)[0] = '\n';
        (acStack_2428 + sVar5)[1] = '\r';
        acStack_2428[sVar5 + 2] = '\0';
      }
      pfVar1 = pfVar7 + 1;
      pfVar7 = pfVar7 + 1;
    } while (pfVar1->name != (char *)0x0);
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_rinfo(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	ROOM_INDEX_DATA *location;

	one_argument(argument, arg);

	location = (arg[0] == '\0')
		? ch->in_room
		: find_location(ch, arg);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	sprintf(buf, "Room %d flags (%s):\n\r", location->vnum, location->name);

	if (IS_SET(location->area->area_flags, AREA_EXPLORE))
		strcat(buf, "AREA_EXPLORE\n\r");

	if (IS_SET(location->area->area_flags, AREA_NO_NEWBIES))
		strcat(buf, "AREA_NO_NEWBIES\n\r");

	if (IS_SET(location->area->area_flags, AREA_UNGHOST))
		strcat(buf, "AREA_UNGHOST\n\r");

	for (int i = 0; room_flags[i].name != nullptr; i++)
	{
		if (IS_SET(location->room_flags, room_flags[i].bit))
		{
			strcat(buf, "ROOM ");
			strcat(buf, upstring(room_flags[i].name));
			strcat(buf, "\n\r");
		}
	}

	if (location->room_flags == 0 && location->area->area_flags == 0)
		strcat(buf, "(no flags)\n\r");

	send_to_char(buf, ch);
}